

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

void do_db(int *ip)

{
  byte bVar1;
  char cVar2;
  ushort *puVar3;
  t_symbol *ptVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ushort **ppuVar8;
  ulong uVar9;
  char *pcVar10;
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  data_level = 2;
  ppuVar8 = __ctype_b_loc();
  puVar3 = *ppuVar8;
  uVar9 = (ulong)*ip;
  pcVar10 = prlnbuf + uVar9;
  do {
    pcVar10 = pcVar10 + 1;
    uVar5 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar5;
    *ip = uVar5;
  } while ((*(byte *)((long)puVar3 + (long)*pcVar10 * 2 + 1) & 0x20) != 0);
LAB_00109ee9:
  if (prlnbuf[(int)uVar9] == '\"') {
    do {
      iVar6 = (int)uVar9;
      *ip = iVar6 + 1;
      bVar1 = prlnbuf[(long)iVar6 + 1];
      uVar5 = (uint)bVar1;
      if (bVar1 == 0x5c) {
        *ip = iVar6 + 2;
        bVar1 = prlnbuf[(long)iVar6 + 2];
        uVar5 = (uint)bVar1;
        if (bVar1 == 0x6e) {
          uVar5 = 10;
        }
        else if (bVar1 == 0x74) {
          uVar5 = 9;
        }
        else if (bVar1 == 0x72) {
          uVar5 = 0xd;
        }
      }
      else {
        if (bVar1 == 0x22) goto LAB_00109f96;
        if (bVar1 == 0) {
          pcVar10 = "Unterminated ASCII string!";
          goto LAB_00109ff8;
        }
      }
      if (pass == 1) {
        putbyte(loccnt,uVar5);
      }
      loccnt = loccnt + 1;
      uVar9 = (ulong)(uint)*ip;
    } while( true );
  }
  iVar7 = evaluate(ip,'\0');
  iVar6 = loccnt;
  if (iVar7 == 0) {
    return;
  }
  loccnt = loccnt + 1;
  if (pass == 1) {
    if (0xfffffe7f < value - 0x100) {
      putbyte(iVar6,value);
      goto LAB_00109f9b;
    }
    pcVar10 = "Overflow error!";
    goto LAB_00109ff8;
  }
LAB_00109f9b:
  iVar6 = *ip;
  uVar5 = iVar6 + 1;
  uVar9 = (ulong)uVar5;
  *ip = uVar5;
  ptVar4 = lablptr;
  cVar2 = prlnbuf[iVar6];
  if (cVar2 != ',') {
    if ((cVar2 == '\0') || (cVar2 == ';')) {
      if (lablptr == (t_symbol *)0x0) {
        if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 0)) {
          lastlabl->data_size = lastlabl->data_size + (loccnt - data_loccnt);
        }
      }
      else {
        lablptr->data_type = 0;
        ptVar4->data_size = loccnt - data_loccnt;
      }
      if (pass != 1) {
        return;
      }
      println();
      return;
    }
    pcVar10 = "Syntax error!";
LAB_00109ff8:
    error(pcVar10);
    return;
  }
  goto LAB_00109ee9;
LAB_00109f96:
  *ip = iVar6 + 2;
  goto LAB_00109f9b;
}

Assistant:

void
do_db(int *ip)
{
	unsigned char c;

	/* define label */
	labldef(loccnt, 1);

	/* output infos */
	data_loccnt = loccnt;
	data_level  = 2;

	/* skip spaces */
	while (isspace(prlnbuf[++(*ip)]));

	/* get bytes */
	for (;;) {
		/* ASCII string */
		if (prlnbuf[*ip] == '\"') {
			for (;;) {
				c = prlnbuf[++(*ip)];
				if (c == '\"')
					break;
				if (c == '\0') {
					error("Unterminated ASCII string!");
					return;
				}
				if (c == '\\') {
					c = prlnbuf[++(*ip)];
					switch(c) {
					case 'r':
						c = '\r';
						break;
					case 'n':
						c = '\n';
						break;
					case 't':
						c = '\t';
						break;
					}
				}
				/* store char on last pass */
				if (pass == LAST_PASS)
					putbyte(loccnt, c);

				/* update location counter */
				loccnt++;
			}
			(*ip)++;
		}
		/* bytes */
		else {
			/* get a byte */
			if (!evaluate(ip, 0))
				return;

			/* update location counter */
			loccnt++;

			/* store byte on last pass */
			if (pass == LAST_PASS) {
				/* check for overflow */
				if ((value > 0xFF) && (value < 0xFFFFFF80)) {
					error("Overflow error!");
					return;
				}

				/* store byte */
				putbyte(loccnt - 1, value);
			}
		}

		/* check if there's another byte */
		c = prlnbuf[(*ip)++];

		if (c != ',')
			break;
	}

	/* check error */
	if (c != ';' && c != '\0') {
		error("Syntax error!");
		return;
	}

	/* size */
	if (lablptr) {
		lablptr->data_type = P_DB;
		lablptr->data_size = loccnt - data_loccnt;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_DB)
				lastlabl->data_size += loccnt - data_loccnt;
		}
	}

	/* output line */
	if (pass == LAST_PASS)
		println();
}